

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

ostream * nuraft::operator<<(ostream *out,buffer *buf)

{
  long lVar1;
  char *pcVar2;
  
  if (((&out->field_0x20)[(long)out->_vptr_basic_ostream[-3]] & 5) == 0) {
    if ((int)*(uint *)buf < 0) {
      lVar1 = (ulong)*(uint *)(buf + 4) + 8;
    }
    else {
      lVar1 = (ulong)(*(uint *)buf >> 0x10) + 4;
    }
    std::ostream::write((char *)out,(long)(buf + lVar1));
    if (((&out->field_0x20)[(long)out->_vptr_basic_ostream[-3]] & 5) == 0) {
      return out;
    }
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"write failed");
  }
  else {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"bad output stream.");
  }
  __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

std::ostream& nuraft::operator << (std::ostream& out, buffer& buf) {
    if (!out) {
        throw std::ios::failure("bad output stream.");
    }

    out.write(reinterpret_cast<char*>(buf.data()), buf.size() - buf.pos());

    if (!out) {
        throw std::ios::failure("write failed");
    }

    return out;
}